

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::MergePartialFromCodedStream
          (BorderAmounts_EdgeSizes *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  uint64 *puVar7;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
  do {
    pbVar4 = input->buffer_;
    uVar2 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar5 = *pbVar4;
      uVar2 = (uint32)bVar5;
      if ((char)bVar5 < '\x01') goto LAB_0013dd73;
      input->buffer_ = pbVar4 + 1;
      uVar8 = (ulong)bVar5 | 0x100000000;
    }
    else {
LAB_0013dd73:
      uVar2 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar2);
      uVar8 = 0;
      if (uVar2 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar2 | uVar8;
    }
    uVar2 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_0013ddee:
      iVar6 = 7;
      if (((uVar2 & 7) != 4 && uVar2 != 0) &&
         (bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar2), iVar6 = 6,
         bVar1)) {
LAB_0013de13:
        iVar6 = 0;
      }
    }
    else {
      uVar3 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar3 != 2) {
        if ((uVar3 != 1) || ((char)uVar8 != '\b')) goto LAB_0013ddee;
        pbVar4 = input->buffer_;
        if ((input->buffer_end_ <= pbVar4) ||
           (bVar5 = *pbVar4, puVar7 = &this->startedgesize_, (char)bVar5 < '\0')) {
          pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->startedgesize_ = pVar9.first;
          goto LAB_0013de2b;
        }
LAB_0013dde0:
        *puVar7 = (ulong)bVar5;
        input->buffer_ = pbVar4 + 1;
        goto LAB_0013de13;
      }
      if ((char)uVar8 != '\x10') goto LAB_0013ddee;
      pbVar4 = input->buffer_;
      if ((pbVar4 < input->buffer_end_) &&
         (bVar5 = *pbVar4, puVar7 = &this->endedgesize_, -1 < (char)bVar5)) goto LAB_0013dde0;
      pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->endedgesize_ = pVar9.first;
LAB_0013de2b:
      iVar6 = 6;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0013de13;
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool BorderAmounts_EdgeSizes::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 startEdgeSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &startedgesize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 endEdgeSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &endedgesize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BorderAmounts.EdgeSizes)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BorderAmounts.EdgeSizes)
  return false;
#undef DO_
}